

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaMultiGenerator::cmGlobalNinjaMultiGenerator
          (cmGlobalNinjaMultiGenerator *this,cmake *cm)

{
  cmState *pcVar1;
  cmake *cm_local;
  cmGlobalNinjaMultiGenerator *this_local;
  
  cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(&this->super_cmGlobalNinjaGenerator,cm);
  (this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.super_cmGlobalGenerator.
  _vptr_cmGlobalGenerator = (_func_int **)&PTR__cmGlobalNinjaMultiGenerator_00fafa38;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
  ::map(&this->ImplFileStreams);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
  ::map(&this->ConfigFileStreams);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->CommonFileStream);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->DefaultFileStream);
  pcVar1 = cmake::GetState(cm);
  cmState::SetIsGeneratorMultiConfig(pcVar1,true);
  pcVar1 = cmake::GetState(cm);
  cmState::SetNinjaMulti(pcVar1,true);
  return;
}

Assistant:

cmGlobalNinjaMultiGenerator::cmGlobalNinjaMultiGenerator(cmake* cm)
  : cmGlobalNinjaGenerator(cm)
{
  cm->GetState()->SetIsGeneratorMultiConfig(true);
  cm->GetState()->SetNinjaMulti(true);
}